

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O2

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort *puVar6;
  int resshift;
  int iVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(long *)((long)param + 0x10) != 0) {
    bVar8 = *(byte *)((long)param + 0x340) & 0xfe;
    for (uVar14 = 0; uVar14 != samples; uVar14 = uVar14 + 1) {
      for (uVar15 = 0; uVar15 < *(byte *)((long)param + 0x338); uVar15 = uVar15 + 1) {
        lVar13 = uVar15 * 0x18;
        bVar10 = *(byte *)((long)param + lVar13 + 0x3c);
        if (((bVar10 & 1) == 0) &&
           (puVar6 = (ushort *)((long)param + lVar13 + 0x38), *(char *)((long)puVar6 + 0x15) == '\0'
           )) {
          uVar12 = (ulong)((uint)(byte)puVar6[6] * 4);
          uVar3 = *(uint *)((long)wavemasks + uVar12);
          uVar4 = *(uint *)(puVar6 + 4);
          uVar2 = puVar6[1];
          resshift = resshifts[*(byte *)((long)puVar6 + 0xd)] - (uint)(byte)puVar6[6];
          uVar9 = *(uint *)(puVar6 + 8) >> ((byte)resshift & 0x1f);
          uVar5 = *(uint *)((long)accmasks + uVar12);
          bVar1 = *(byte *)((long)param + 0x341);
          *(uint *)(puVar6 + 8) = (uint)*puVar6 + *(uint *)(puVar6 + 8);
          *(byte *)((long)param + 0x33a) = bVar10 >> 4;
          bVar11 = *(byte *)(*(long *)((long)param + 0x10) +
                            (ulong)((uVar5 & uVar9) + (uVar3 & uVar4)));
          *(byte *)(puVar6 + 3) = bVar11;
          iVar7 = 1;
          if (bVar11 != 0) {
            if (((bVar10 & 6) == 4) && ((uVar15 & 1) != 0)) {
              iVar7 = 0;
              if ((uVar15 < 0x1f) && ((*(byte *)((long)param + lVar13 + 0x54) & 1) == 0)) {
                *(byte *)((long)param + lVar13 + 0x55) = bVar11;
              }
            }
            else {
              iVar7 = (uint)*(byte *)((long)puVar6 + 5) * (bVar11 - 0x80);
            }
            bVar1 = bVar1 & bVar10 >> 4;
            for (bVar10 = 0; bVar8 != bVar10; bVar10 = bVar10 + 1) {
              if (bVar1 == bVar10) {
                outputs[bVar1 & 1][uVar14] = outputs[bVar1 & 1][uVar14] + iVar7;
              }
            }
            iVar7 = iVar7 * 0xb5 >> 8;
            bVar10 = *(byte *)((long)param + 0x340);
            for (bVar11 = bVar8; bVar11 < bVar10; bVar11 = bVar11 + 1) {
              if (bVar1 == bVar11) {
                (*outputs)[uVar14] = (*outputs)[uVar14] + iVar7;
                outputs[1][uVar14] = outputs[1][uVar14] + iVar7;
              }
            }
            iVar7 = 0;
            if (uVar9 < (uVar2 - 1 & 0xffff)) goto LAB_0015c7db;
          }
          es5503_halt_osc((ES5503Chip *)param,(int)uVar15,iVar7,(UINT32 *)(puVar6 + 8),resshift);
        }
LAB_0015c7db:
      }
    }
  }
  return;
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->docram == NULL)
		return;

	chnsStereo = chip->output_channels & ~1;
	for (snum = 0; snum < samples; snum++)
	{
		for (osc = 0; osc < chip->oscsenabled; osc++)
		{
			ES5503Osc *pOsc = &chip->oscillators[osc];

			if (!(pOsc->control & 1) && ! pOsc->Muted)
			{
				UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
				UINT32 altram;
				UINT16 wtsize = pOsc->wtsize - 1;
				UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
				int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
				UINT32 sizemask = accmasks[pOsc->wavetblsize];
				const int mode = (pOsc->control>>1) & 3;

				chnMask &= chip->outchn_mask;
				altram = pOsc->accumulator >> resshift;
				ramptr = altram & sizemask;

				pOsc->accumulator += pOsc->freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &pOsc->accumulator, resshift);
				}
				else
				{
					INT32 outData;
					if (mode != MODE_SYNCAM)
					{
						outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
					}
					else
					{
						// if we're odd, we play nothing ourselves
						if (osc & 1)
						{
							if (osc < 31)
							{
								// if the next oscillator up is playing, it's volume becomes our control
								if (!(chip->oscillators[osc + 1].control & 1))
								{
									chip->oscillators[osc + 1].vol = pOsc->data;
								}
							}
							outData = 0;
						}
						else    // hard sync, both oscillators play?
						{
							outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
						}
					}

					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &pOsc->accumulator, resshift);
					}
				}
			}	// end if (oscillators[osc] playing)
		}	// end for (osc)
	}	// end for (snum)
}